

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

Error __thiscall
asmjit::BaseBuilder::_newAlignNode
          (BaseBuilder *this,AlignNode **out,uint32_t alignMode,uint32_t alignment)

{
  Error EVar1;
  Error extraout_EAX;
  Error EVar2;
  AlignNode *pAVar3;
  BaseBuilder *unaff_RBX;
  AlignNode **unaff_R14;
  size_t sStack_28;
  
  *out = (AlignNode *)0x0;
  if ((this->_allocator)._zone == (Zone *)0x0) {
    _newAlignNode();
    EVar1 = extraout_EAX;
  }
  else {
    pAVar3 = (AlignNode *)ZoneAllocator::_alloc(&this->_allocator,0x38,&sStack_28);
    EVar2 = 0;
    unaff_RBX = this;
    unaff_R14 = out;
    EVar1 = 0;
    if (pAVar3 != (AlignNode *)0x0) {
      (pAVar3->super_BaseNode).field_0.field_0._prev = (BaseNode *)0x0;
      (pAVar3->super_BaseNode).field_0.field_0._next = (BaseNode *)0x0;
      (pAVar3->super_BaseNode).field_1._any._nodeType = '\x04';
      (pAVar3->super_BaseNode).field_1._any._nodeFlags = (byte)this->_nodeFlags | 0x11;
      *(undefined8 *)((long)&(pAVar3->super_BaseNode).field_1 + 2) = 0;
      *(undefined8 *)((long)&(pAVar3->super_BaseNode).field_3 + 2) = 0;
      (pAVar3->super_BaseNode)._passData = (void *)0x0;
      (pAVar3->super_BaseNode)._inlineComment = (char *)0x0;
      pAVar3->_alignMode = alignMode;
      pAVar3->_alignment = alignment;
      goto LAB_00112c0e;
    }
  }
  EVar2 = EVar1;
  pAVar3 = (AlignNode *)0x0;
LAB_00112c0e:
  *unaff_R14 = pAVar3;
  if (pAVar3 == (AlignNode *)0x0) {
    EVar2 = BaseEmitter::reportError(&unaff_RBX->super_BaseEmitter,1,(char *)0x0);
  }
  return EVar2;
}

Assistant:

Error BaseBuilder::_newAlignNode(AlignNode** out, uint32_t alignMode, uint32_t alignment) {
  *out = nullptr;
  return _newNodeT<AlignNode>(out, alignMode, alignment);
}